

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

int __thiscall
NULLCFile::FileReadArr(NULLCFile *this,NULLCArray arr,uint offset,uint count,File *file)

{
  FILE *__stream;
  size_t sVar1;
  char *error;
  undefined4 in_register_00000084;
  
  if (CONCAT44(in_register_00000084,count) == 0) {
    error = "ERROR: null pointer access";
  }
  else {
    __stream = *(FILE **)(CONCAT44(in_register_00000084,count) + 4);
    if (__stream != (FILE *)0x0) {
      if ((ulong)(uint)arr.ptr < (ulong)offset + (ulong)arr.len) {
        nullcThrowError("Array can\'t hold %d bytes from the specified offset.",(ulong)offset);
        return 0;
      }
      if (this != (NULLCFile *)0x0) {
        sVar1 = fread(this + arr.len,1,(ulong)offset,__stream);
        return (int)sVar1;
      }
      return 0;
    }
    error = "Cannot read from a closed file.";
  }
  nullcThrowError(error);
  return 0;
}

Assistant:

int FileReadArr(NULLCArray arr, unsigned offset, unsigned count, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot read from a closed file.");
			return 0;
		}

		if((long long)count + offset > arr.len)
		{
			nullcThrowError("Array can't hold %d bytes from the specified offset.", count);
			return 0;
		}

		return arr.ptr ? int(fread(arr.ptr + offset, 1, count, file->handle)) : 0;
	}